

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O1

Storyboard * __thiscall
ApprovalTests::Storyboard::addDescriptionWithData(Storyboard *this,string *description,string *data)

{
  ostream *poVar1;
  
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,(description->_M_dataplus)._M_p,
                      description->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(data->_M_dataplus)._M_p,data->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  this->addNewLineBeforeNextFrame_ = true;
  return this;
}

Assistant:

Storyboard& Storyboard::addDescriptionWithData(const std::string& description,
                                                   const std::string& data)
    {
        output_ << description << ": " << data << "\n";
        addNewLineBeforeNextFrame_ = true;
        return *this;
    }